

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmmulticast.c
# Opt level: O2

int libcmmulticast_LTX_writev_func
              (CMtrans_services_conflict svc,mcast_conn_data_ptr mcd,iovec *iov,int iovcnt,
              attr_list attrs)

{
  uint __fd;
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  uint nl;
  sockaddr_in addr;
  msghdr local_68;
  
  __fd = mcd->output_fd;
  addr.sin_family = (mcd->output_addr).sin_family;
  addr.sin_port = (mcd->output_addr).sin_port;
  addr.sin_addr.s_addr = (mcd->output_addr).sin_addr.s_addr;
  addr.sin_zero._0_4_ = *(undefined4 *)(mcd->output_addr).sin_zero;
  addr.sin_zero._4_4_ = *(undefined4 *)((mcd->output_addr).sin_zero + 4);
  (*svc->trace_out)(mcd->mtd->cm,"CMMcast writev of %d vectors on fd %d",(ulong)(uint)iovcnt,
                    (ulong)__fd);
  local_68.msg_control = (void *)0x0;
  local_68.msg_controllen = 0;
  local_68.msg_flags = 0;
  local_68._52_4_ = 0;
  local_68.msg_namelen = 0x10;
  local_68._12_4_ = 0;
  local_68.msg_iovlen = (size_t)iovcnt;
  local_68.msg_name = &addr;
  local_68.msg_iov = (iovec *)iov;
  sVar3 = sendmsg(__fd,&local_68,0);
  if (-1 < sVar3) {
    if ((mcd->my_addr).sin_port == 0) {
      uVar1 = get_self_ip_addr((void *)0x0,svc);
      nl = 0x10;
      iVar2 = getsockname(__fd,(sockaddr *)&mcd->my_addr,&nl);
      if (iVar2 != 0) {
        perror("getsockname");
      }
      (mcd->my_addr).sin_addr.s_addr =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    return iovcnt;
  }
  perror("write sendmsg");
  exit(1);
}

Assistant:

extern int
libcmmulticast_LTX_writev_func(CMtrans_services svc, mcast_conn_data_ptr mcd, struct iovec *iov, int iovcnt, attr_list attrs)
{
    SOCKET fd = mcd->output_fd;
#ifndef _MSC_VER
    // no real equivalent on windows
    struct sockaddr_in addr = mcd->output_addr;
    struct msghdr msg;
    svc->trace_out(mcd->mtd->cm, "CMMcast writev of %d vectors on fd %d",
		   iovcnt, fd);
    memset(&msg, 0, sizeof(msg));
    msg.msg_name = (void*)&addr;
    msg.msg_namelen = sizeof(addr);
    msg.msg_iov = &iov[0];
    msg.msg_iovlen = iovcnt;
    if (sendmsg(fd, &msg, 0) < 0) {
	perror("write sendmsg");
	exit(1);
    }
#endif
    if (mcd->my_addr.sin_port == 0) {
	unsigned int nl;
	int IP = get_self_ip_addr(NULL, svc);
	nl = sizeof(struct sockaddr_in);
	if (getsockname(fd, (struct sockaddr *) &mcd->my_addr, &nl) != 0)
	    perror("getsockname");


	mcd->my_addr.sin_addr.s_addr = htonl(IP);
    }
    return iovcnt;
}